

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflection_IsDescendantExtension_Test::TestBody
          (GeneratedMessageReflection_IsDescendantExtension_Test *this)

{
  bool bVar1;
  MessageLite *pMVar2;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  TestAllExtensions msg1;
  TestAllExtensions msg2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c0;
  AssertHelper local_b8;
  internal local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  string local_a0;
  undefined1 local_80 [48];
  undefined1 local_50 [48];
  
  proto2_unittest::TestAllExtensions::TestAllExtensions((TestAllExtensions *)local_80,(Arena *)0x0);
  proto2_unittest::TestAllExtensions::TestAllExtensions((TestAllExtensions *)local_50,(Arena *)0x0);
  TestUtil::SetAllExtensions<proto2_unittest::TestAllExtensions>((TestAllExtensions *)local_80);
  proto2_unittest::TestAllExtensions::CopyFrom
            ((TestAllExtensions *)local_50,(TestAllExtensions *)local_80);
  pMVar2 = protobuf::internal::ExtensionSet::GetMessage
                     ((ExtensionSet *)(local_80 + 0x10),
                      proto2_unittest::optional_nested_message_extension,
                      (MessageLite *)PTR__TestAllTypes_NestedMessage_default_instance__019a4110);
  local_b0[0] = (internal)protobuf::internal::IsDescendant((Message *)local_80,(Message *)pMVar2);
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_b0[0]) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,local_b0,
               (AssertionResult *)
               "IsDescendant( msg1, msg1.GetExtension(unittest::optional_nested_message_extension))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x6c5,local_a0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  pMVar2 = protobuf::internal::ExtensionSet::GetRepeatedMessage
                     ((ExtensionSet *)(local_80 + 0x10),
                      proto2_unittest::repeated_foreign_message_extension,0);
  local_b0[0] = (internal)protobuf::internal::IsDescendant((Message *)local_80,(Message *)pMVar2);
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_b0[0]) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,local_b0,
               (AssertionResult *)
               "IsDescendant( msg1, msg1.GetExtension(unittest::repeated_foreign_message_extension, 0))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x6c8,local_a0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  pMVar2 = protobuf::internal::ExtensionSet::GetMessage
                     ((ExtensionSet *)(local_50 + 0x10),
                      proto2_unittest::optional_nested_message_extension,
                      (MessageLite *)PTR__TestAllTypes_NestedMessage_default_instance__019a4110);
  bVar1 = protobuf::internal::IsDescendant((Message *)local_80,(Message *)pMVar2);
  local_b0[0] = (internal)!bVar1;
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,local_b0,
               (AssertionResult *)
               "IsDescendant( msg1, msg2.GetExtension(unittest::optional_nested_message_extension))"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x6cb,local_a0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  pMVar2 = protobuf::internal::ExtensionSet::GetRepeatedMessage
                     ((ExtensionSet *)(local_50 + 0x10),
                      proto2_unittest::repeated_foreign_message_extension,0);
  bVar1 = protobuf::internal::IsDescendant((Message *)local_80,(Message *)pMVar2);
  local_b0[0] = (internal)!bVar1;
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,local_b0,
               (AssertionResult *)
               "IsDescendant( msg1, msg2.GetExtension(unittest::repeated_foreign_message_extension, 0))"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x6ce,local_a0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  proto2_unittest::TestAllExtensions::~TestAllExtensions((TestAllExtensions *)local_50);
  proto2_unittest::TestAllExtensions::~TestAllExtensions((TestAllExtensions *)local_80);
  return;
}

Assistant:

TEST(GeneratedMessageReflection, IsDescendantExtension) {
  unittest::TestAllExtensions msg1, msg2;
  TestUtil::SetAllExtensions(&msg1);
  msg2 = msg1;

  EXPECT_TRUE(IsDescendant(
      msg1, msg1.GetExtension(unittest::optional_nested_message_extension)));
  EXPECT_TRUE(IsDescendant(
      msg1,
      msg1.GetExtension(unittest::repeated_foreign_message_extension, 0)));

  EXPECT_FALSE(IsDescendant(
      msg1, msg2.GetExtension(unittest::optional_nested_message_extension)));
  EXPECT_FALSE(IsDescendant(
      msg1,
      msg2.GetExtension(unittest::repeated_foreign_message_extension, 0)));
}